

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_parsecfg.c
# Opt level: O0

int parseconfig(char *filename,GlobalConfig *global)

{
  char cVar1;
  bool bVar2;
  char *flag;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  void *pvVar6;
  char *pcVar7;
  bool bVar8;
  char *reason;
  _Bool dashed_option;
  _Bool alloced_param;
  char *pcStack_268;
  int lineno;
  char *param;
  char *option;
  char *aline;
  char *line;
  OperationConfig *operation;
  int rc;
  char *home;
  undefined1 local_228 [7];
  _Bool usedarg;
  char filebuffer [512];
  FILE *file;
  int res;
  GlobalConfig *global_local;
  char *filename_local;
  
  home._7_1_ = 0;
  operation._4_4_ = 0;
  line = (char *)global->first;
  if ((filename == (char *)0x0) || (global_local = (GlobalConfig *)filename, *filename == '\0')) {
    global_local = (GlobalConfig *)0x1254da;
    pcVar4 = homedir();
    if (pcVar4 != (char *)0x0) {
      sVar5 = strlen(pcVar4);
      if (sVar5 < 0x1f9) {
        curl_msnprintf(local_228,0x200,"%s%s%s",pcVar4,"/",".curlrc");
        global_local = (GlobalConfig *)local_228;
      }
      free(pcVar4);
    }
  }
  iVar3 = strcmp((char *)global_local,"-");
  if (iVar3 == 0) {
    filebuffer[0x1f8] = stdin;
    filebuffer[0x1f9] = stdin_1;
    filebuffer[0x1fa] = uRam0000000000131142;
    filebuffer[0x1fb] = uRam0000000000131143;
    filebuffer[0x1fc] = uRam0000000000131144;
    filebuffer[0x1fd] = uRam0000000000131145;
    filebuffer[0x1fe] = uRam0000000000131146;
    filebuffer[0x1ff] = uRam0000000000131147;
  }
  else {
    filebuffer._504_8_ = fopen64((char *)global_local,"r");
  }
  if (filebuffer._504_8_ == 0) {
    operation._4_4_ = 1;
  }
  else {
    reason._4_4_ = 0;
    while (pcVar4 = my_get_line((FILE *)filebuffer._504_8_), pcVar4 != (char *)0x0) {
      reason._4_4_ = reason._4_4_ + 1;
      bVar2 = false;
      aline = pcVar4;
      while( true ) {
        flag = aline;
        bVar8 = false;
        if (*aline != '\0') {
          iVar3 = Curl_isspace((uint)(byte)*aline);
          bVar8 = iVar3 != 0;
        }
        if (!bVar8) break;
        aline = aline + 1;
      }
      cVar1 = *aline;
      if (((((cVar1 == '\0') || (cVar1 == '\n')) || (cVar1 == '\r')) ||
          ((cVar1 == '#' || (cVar1 == '*')))) || (cVar1 == '/')) {
        free(pcVar4);
      }
      else {
        cVar1 = *aline;
        while( true ) {
          bVar8 = false;
          if (*aline != '\0') {
            iVar3 = Curl_isspace((uint)(byte)*aline);
            bVar8 = false;
            if (iVar3 == 0) {
              bVar8 = false;
              if ((cVar1 != '-') && (bVar8 = true, *aline != '=')) {
                bVar8 = *aline == ':';
              }
              bVar8 = (bool)(bVar8 ^ 1);
            }
          }
          if (!bVar8) break;
          aline = aline + 1;
        }
        if (*aline != '\0') {
          *aline = '\0';
          aline = aline + 1;
        }
        while( true ) {
          pcVar7 = aline;
          bVar8 = false;
          if (*aline != '\0') {
            iVar3 = Curl_isspace((uint)(byte)*aline);
            bVar8 = true;
            if (((iVar3 == 0) && (bVar8 = false, cVar1 != '-')) && (bVar8 = true, *aline != '=')) {
              bVar8 = *aline == ':';
            }
          }
          if (!bVar8) break;
          aline = aline + 1;
        }
        if (*aline == '\"') {
          sVar5 = strlen(aline + 1);
          pcStack_268 = (char *)malloc(sVar5 + 1);
          if (pcStack_268 == (char *)0x0) {
            free(pcVar4);
            operation._4_4_ = 1;
            break;
          }
          bVar2 = true;
          unslashquote(aline + 1,pcStack_268);
        }
        else {
          pcStack_268 = aline;
          while( true ) {
            bVar8 = false;
            if (*aline != '\0') {
              iVar3 = Curl_isspace((uint)(byte)*aline);
              bVar8 = iVar3 == 0;
            }
            if (!bVar8) break;
            aline = aline + 1;
          }
          if (*aline != '\0') {
            *aline = '\0';
            do {
              aline = aline + 1;
              bVar8 = false;
              if (*aline != '\0') {
                iVar3 = Curl_isspace((uint)(byte)*aline);
                bVar8 = iVar3 != 0;
              }
            } while (bVar8);
            cVar1 = *aline;
            if (((cVar1 != '\0') && (cVar1 != '\n')) && ((cVar1 != '\r' && (cVar1 != '#')))) {
              warnf(*(GlobalConfig **)(line + 0x468),
                    "%s:%d: warning: \'%s\' uses unquoted white space in the line that may cause side-effects!\n"
                    ,global_local,(ulong)reason._4_4_,flag);
            }
          }
          if (*pcVar7 == '\0') {
            pcStack_268 = (char *)0x0;
          }
        }
        file._4_4_ = getparameter(flag,pcStack_268,(_Bool *)((long)&home + 7),global,
                                  (OperationConfig *)line);
        if (((file._4_4_ == PARAM_OK) && (pcStack_268 != (char *)0x0)) &&
           ((*pcStack_268 != '\0' && ((home._7_1_ & 1) == 0)))) {
          file._4_4_ = PARAM_GOT_EXTRA_PARAMETER;
        }
        if (((file._4_4_ == PARAM_NEXT_OPERATION) && (*(long *)(line + 0x1b0) != 0)) &&
           (*(long *)(*(long *)(line + 0x1b0) + 8) != 0)) {
          pvVar6 = malloc(0x480);
          *(void **)(line + 0x478) = pvVar6;
          if (*(long *)(line + 0x478) == 0) {
            file._4_4_ = PARAM_NO_MEM;
          }
          else {
            config_init(*(OperationConfig **)(line + 0x478));
            **(undefined8 **)(line + 0x478) = global->easy;
            *(GlobalConfig **)(*(long *)(line + 0x478) + 0x468) = global;
            global->last = *(OperationConfig **)(line + 0x478);
            *(char **)(*(long *)(line + 0x478) + 0x470) = line;
            line = *(char **)(line + 0x478);
          }
        }
        if ((file._4_4_ != PARAM_OK) && (file._4_4_ != PARAM_NEXT_OPERATION)) {
          iVar3 = strcmp((char *)global_local,"-");
          if (iVar3 == 0) {
            global_local = (GlobalConfig *)anon_var_dwarf_9f1d;
          }
          if (((file._4_4_ != PARAM_HELP_REQUESTED) && (file._4_4_ != PARAM_MANUAL_REQUESTED)) &&
             ((file._4_4_ != PARAM_VERSION_INFO_REQUESTED && (file._4_4_ != PARAM_ENGINES_REQUESTED)
              ))) {
            pcVar7 = param2text(file._4_4_);
            warnf(*(GlobalConfig **)(line + 0x468),"%s:%d: warning: \'%s\' %s\n",global_local,
                  (ulong)reason._4_4_,flag,pcVar7);
          }
        }
        if (bVar2) {
          free(pcStack_268);
        }
        free(pcVar4);
      }
    }
    if (filebuffer._504_8_ != _stdin) {
      fclose((FILE *)filebuffer._504_8_);
    }
  }
  return operation._4_4_;
}

Assistant:

int parseconfig(const char *filename, struct GlobalConfig *global)
{
  int res;
  FILE *file;
  char filebuffer[512];
  bool usedarg = FALSE;
  char *home;
  int rc = 0;
  struct OperationConfig *operation = global->first;

  if(!filename || !*filename) {
    /* NULL or no file name attempts to load .curlrc from the homedir! */

#ifndef __AMIGA__
    filename = CURLRC;   /* sensible default */
    home = homedir();    /* portable homedir finder */
    if(home) {
      if(strlen(home) < (sizeof(filebuffer) - strlen(CURLRC))) {
        snprintf(filebuffer, sizeof(filebuffer),
                 "%s%s%s", home, DIR_CHAR, CURLRC);

#ifdef WIN32
        /* Check if the file exists - if not, try CURLRC in the same
         * directory as our executable
         */
        file = fopen(filebuffer, FOPEN_READTEXT);
        if(file != NULL) {
          fclose(file);
          filename = filebuffer;
        }
        else {
          /* Get the filename of our executable. GetModuleFileName is
           * already declared via inclusions done in setup header file.
           * We assume that we are using the ASCII version here.
           */
          int n = GetModuleFileNameA(0, filebuffer, sizeof(filebuffer));
          if(n > 0 && n < (int)sizeof(filebuffer)) {
            /* We got a valid filename - get the directory part */
            char *lastdirchar = strrchr(filebuffer, '\\');
            if(lastdirchar) {
              size_t remaining;
              *lastdirchar = 0;
              /* If we have enough space, build the RC filename */
              remaining = sizeof(filebuffer) - strlen(filebuffer);
              if(strlen(CURLRC) < remaining - 1) {
                snprintf(lastdirchar, remaining,
                         "%s%s", DIR_CHAR, CURLRC);
                /* Don't bother checking if it exists - we do
                 * that later
                 */
                filename = filebuffer;
              }
            }
          }
        }
#else /* WIN32 */
        filename = filebuffer;
#endif /* WIN32 */
      }
      Curl_safefree(home); /* we've used it, now free it */
    }

# else /* __AMIGA__ */
    /* On AmigaOS all the config files are into env:
     */
    filename = "ENV:" CURLRC;

#endif
  }

  if(strcmp(filename, "-"))
    file = fopen(filename, FOPEN_READTEXT);
  else
    file = stdin;

  if(file) {
    char *line;
    char *aline;
    char *option;
    char *param;
    int lineno = 0;
    bool alloced_param;
    bool dashed_option;

    while(NULL != (aline = my_get_line(file))) {
      lineno++;
      line = aline;
      alloced_param = FALSE;

      /* line with # in the first non-blank column is a comment! */
      while(*line && ISSPACE(*line))
        line++;

      switch(*line) {
      case '#':
      case '/':
      case '\r':
      case '\n':
      case '*':
      case '\0':
        Curl_safefree(aline);
        continue;
      }

      /* the option keywords starts here */
      option = line;

      /* the option starts with a dash? */
      dashed_option = option[0]=='-'?TRUE:FALSE;

      while(*line && !ISSPACE(*line) && !ISSEP(*line, dashed_option))
        line++;
      /* ... and has ended here */

      if(*line)
        *line++ = '\0'; /* zero terminate, we have a local copy of the data */

#ifdef DEBUG_CONFIG
      fprintf(stderr, "GOT: %s\n", option);
#endif

      /* pass spaces and separator(s) */
      while(*line && (ISSPACE(*line) || ISSEP(*line, dashed_option)))
        line++;

      /* the parameter starts here (unless quoted) */
      if(*line == '\"') {
        /* quoted parameter, do the quote dance */
        line++;
        param = malloc(strlen(line) + 1); /* parameter */
        if(!param) {
          /* out of memory */
          Curl_safefree(aline);
          rc = 1;
          break;
        }
        alloced_param = TRUE;
        (void)unslashquote(line, param);
      }
      else {
        param = line; /* parameter starts here */
        while(*line && !ISSPACE(*line))
          line++;

        if(*line) {
          *line = '\0'; /* zero terminate */

          /* to detect mistakes better, see if there's data following */
          line++;
          /* pass all spaces */
          while(*line && ISSPACE(*line))
            line++;

          switch(*line) {
          case '\0':
          case '\r':
          case '\n':
          case '#': /* comment */
            break;
          default:
            warnf(operation->global, "%s:%d: warning: '%s' uses unquoted "
                  "white space in the line that may cause side-effects!\n",
                  filename, lineno, option);
          }
        }
        if(!*param)
          /* do this so getparameter can check for required parameters.
             Otherwise it always thinks there's a parameter. */
          param = NULL;
      }

#ifdef DEBUG_CONFIG
      fprintf(stderr, "PARAM: \"%s\"\n",(param ? param : "(null)"));
#endif
      res = getparameter(option, param, &usedarg, global, operation);

      if(!res && param && *param && !usedarg)
        /* we passed in a parameter that wasn't used! */
        res = PARAM_GOT_EXTRA_PARAMETER;

      if(res == PARAM_NEXT_OPERATION) {
        if(operation->url_list && operation->url_list->url) {
          /* Allocate the next config */
          operation->next = malloc(sizeof(struct OperationConfig));
          if(operation->next) {
            /* Initialise the newly created config */
            config_init(operation->next);

            /* Copy the easy handle */
            operation->next->easy = global->easy;

            /* Set the global config pointer */
            operation->next->global = global;

            /* Update the last operation pointer */
            global->last = operation->next;

            /* Move onto the new config */
            operation->next->prev = operation;
            operation = operation->next;
          }
          else
            res = PARAM_NO_MEM;
        }
      }

      if(res != PARAM_OK && res != PARAM_NEXT_OPERATION) {
        /* the help request isn't really an error */
        if(!strcmp(filename, "-")) {
          filename = "<stdin>";
        }
        if(res != PARAM_HELP_REQUESTED &&
           res != PARAM_MANUAL_REQUESTED &&
           res != PARAM_VERSION_INFO_REQUESTED &&
           res != PARAM_ENGINES_REQUESTED) {
          const char *reason = param2text(res);
          warnf(operation->global, "%s:%d: warning: '%s' %s\n",
                filename, lineno, option, reason);
        }
      }

      if(alloced_param)
        Curl_safefree(param);

      Curl_safefree(aline);
    }
    if(file != stdin)
      fclose(file);
  }
  else
    rc = 1; /* couldn't open the file */

  return rc;
}